

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroMapEntriesIntValuePopulatedInGenCode_Test::
~NoFieldPresenceTest_TestNonZeroMapEntriesIntValuePopulatedInGenCode_Test
          (NoFieldPresenceTest_TestNonZeroMapEntriesIntValuePopulatedInGenCode_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroMapEntriesIntValuePopulatedInGenCode) {
  // Set nonzero values for key-value pairs and test that.
  TestAllMapTypes message;
  (*message.mutable_map_int32_foreign_enum())[99] = FOREIGN_BAZ;

  ASSERT_NE(0, static_cast<uint32_t>(FOREIGN_BAZ));

  EXPECT_EQ(1, message.map_int32_foreign_enum().size());
  // Keys can be found.
  EXPECT_TRUE(message.map_int32_foreign_enum().contains(99));
  // Values are counted properly.
  EXPECT_EQ(1, message.map_int32_foreign_enum().count(99));
  // Value can be retrieved.
  EXPECT_EQ(FOREIGN_BAZ, message.map_int32_foreign_enum().at(99));

  // Note that `has_foo` APIs are not available for implicit presence fields.
  // So there is no way to check has_field behaviour in gencode.
}